

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

idx_t duckdb::TemplatedUpdateNumericStatistics<duckdb::uhugeint_t>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  uint64_t *puVar1;
  NumericValueUnion *pNVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar6;
  bool bVar7;
  ulong uVar8;
  uhugeint_t *puVar9;
  ulong uVar10;
  NumericValueUnion *pNVar11;
  idx_t iVar12;
  uhugeint_t local_48;
  ulong local_38;
  
  pdVar3 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      pNVar2 = &(stats->statistics).stats_union.numeric_data.min;
      pNVar11 = &(stats->statistics).stats_union.numeric_data.max;
      uVar10 = 0;
      do {
        psVar4 = update->sel->sel_vector;
        uVar8 = uVar10;
        if (psVar4 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar4[uVar10];
        }
        puVar1 = (uint64_t *)(pdVar3 + uVar8 * 0x10);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        bVar7 = uhugeint_t::operator>((uhugeint_t *)pNVar2,&local_48);
        puVar9 = (uhugeint_t *)pNVar2;
        if (bVar7) {
          puVar9 = &local_48;
        }
        uVar6 = puVar9->upper;
        (pNVar2->value_).bigint = puVar9->lower;
        *(uint64_t *)((long)&(stats->statistics).stats_union + 0x10) = uVar6;
        bVar7 = uhugeint_t::operator>(&local_48,(uhugeint_t *)pNVar11);
        puVar9 = (uhugeint_t *)pNVar11;
        if (bVar7) {
          puVar9 = &local_48;
        }
        uVar6 = puVar9->upper;
        (pNVar11->value_).bigint = puVar9->lower;
        *(uint64_t *)((long)&(stats->statistics).stats_union + 0x20) = uVar6;
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar12 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar12 = 0;
    }
    else {
      pNVar2 = &(stats->statistics).stats_union.numeric_data.min;
      pNVar11 = &(stats->statistics).stats_union.numeric_data.max;
      uVar10 = 0;
      iVar12 = 0;
      local_38 = count;
      do {
        psVar4 = update->sel->sel_vector;
        uVar8 = uVar10;
        if (psVar4 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar4[uVar10];
        }
        puVar5 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
          sel->sel_vector[iVar12] = (sel_t)uVar10;
          iVar12 = iVar12 + 1;
          puVar1 = (uint64_t *)(pdVar3 + uVar8 * 0x10);
          local_48.lower = *puVar1;
          local_48.upper = puVar1[1];
          bVar7 = uhugeint_t::operator>((uhugeint_t *)pNVar2,&local_48);
          puVar9 = (uhugeint_t *)pNVar2;
          if (bVar7) {
            puVar9 = &local_48;
          }
          uVar6 = puVar9->upper;
          (pNVar2->value_).bigint = puVar9->lower;
          *(uint64_t *)((long)&(stats->statistics).stats_union + 0x10) = uVar6;
          bVar7 = uhugeint_t::operator>(&local_48,(uhugeint_t *)pNVar11);
          puVar9 = (uhugeint_t *)pNVar11;
          if (bVar7) {
            puVar9 = &local_48;
          }
          uVar6 = puVar9->upper;
          (pNVar11->value_).bigint = puVar9->lower;
          *(uint64_t *)((long)&(stats->statistics).stats_union + 0x20) = uVar6;
        }
        uVar10 = uVar10 + 1;
      } while (local_38 != uVar10);
    }
  }
  return iVar12;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}